

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
           (double *begin,double *end)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 uVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
  pVar10;
  
  dVar2 = *begin;
  iVar4 = *(int *)(begin + 1);
  for (pdVar6 = (double *)0x10;
      (*(double *)((long)begin + (long)pdVar6) < dVar2 ||
      ((*(double *)((long)begin + (long)pdVar6) <= dVar2 &&
       (*(int *)((long)(begin + 1) + (long)pdVar6) < iVar4)))); pdVar6 = pdVar6 + 2) {
  }
  pdVar1 = (double *)((long)begin + (long)pdVar6);
  if (pdVar6 == (double *)0x10) {
    while (pdVar7 = end, end = pdVar7, pdVar1 < pdVar7) {
      end = pdVar7 + -2;
      if ((pdVar7[-2] < dVar2) || ((pdVar7[-2] <= dVar2 && (*(int *)(pdVar7 + -1) < iVar4)))) break;
    }
  }
  else {
    do {
      pdVar7 = end;
      end = pdVar7 + -2;
      if (pdVar7[-2] < dVar2) break;
    } while ((dVar2 < pdVar7[-2]) || (iVar4 <= *(int *)(pdVar7 + -1)));
  }
  pdVar7 = end;
  pdVar9 = pdVar1;
  if (pdVar1 < end) {
    do {
      dVar3 = *pdVar9;
      *pdVar9 = *pdVar7;
      *pdVar7 = dVar3;
      uVar5 = *(undefined4 *)(pdVar9 + 1);
      *(undefined4 *)(pdVar9 + 1) = *(undefined4 *)(pdVar7 + 1);
      *(undefined4 *)(pdVar7 + 1) = uVar5;
      do {
        do {
          pdVar6 = pdVar9;
          pdVar9 = pdVar6 + 2;
        } while (*pdVar9 < dVar2);
      } while ((*pdVar9 <= dVar2) && (*(int *)(pdVar6 + 3) < iVar4));
      do {
        pdVar8 = pdVar7;
        pdVar6 = pdVar8 + -2;
        pdVar7 = pdVar6;
        if (pdVar8[-2] < dVar2) break;
      } while ((dVar2 < pdVar8[-2]) || (iVar4 <= *(int *)(pdVar8 + -1)));
    } while (pdVar9 < pdVar6);
  }
  pVar10._9_7_ = (undefined7)((ulong)pdVar6 >> 8);
  pVar10.second = end <= pdVar1;
  *begin = pdVar9[-2];
  *(undefined4 *)(begin + 1) = *(undefined4 *)(pdVar9 + -1);
  pdVar9[-2] = dVar2;
  *(int *)(pdVar9 + -1) = iVar4;
  pVar10.first._M_current = (pair<double,_int> *)(pdVar9 + -2);
  return pVar10;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }